

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

bstring bjoin(bstrList *bl,bstring sep)

{
  uint uVar1;
  int iVar2;
  bstring __ptr;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  size_t __n;
  long lVar8;
  long lVar9;
  
  if (((bl != (bstrList *)0x0) && (uVar1 = bl->qty, -1 < (int)uVar1)) &&
     ((sep == (bstring)0x0 || ((-1 < sep->slen && (sep->data != (uchar *)0x0)))))) {
    if (uVar1 == 0) {
      iVar6 = 1;
    }
    else {
      iVar6 = 1;
      uVar4 = 1;
      if (1 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      uVar5 = 0;
      do {
        iVar7 = bl->entry[uVar5]->slen;
        if (iVar7 < 0) {
          return (bstring)0x0;
        }
        iVar6 = iVar6 + iVar7;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    if (sep != (bstring)0x0) {
      iVar6 = iVar6 + (uVar1 - 1) * sep->slen;
    }
    __ptr = (bstring)malloc(0x10);
    if (__ptr != (bstring)0x0) {
      puVar3 = (uchar *)malloc((long)iVar6);
      __ptr->data = puVar3;
      if (puVar3 != (uchar *)0x0) {
        __ptr->mlen = iVar6;
        __ptr->slen = iVar6 + -1;
        iVar6 = bl->qty;
        iVar7 = 0;
        if ((long)iVar6 < 1) {
          lVar8 = 0;
        }
        else {
          lVar9 = 0;
          do {
            if (lVar9 != 0 && sep != (bstring)0x0) {
              iVar2 = sep->slen;
              memcpy(puVar3 + iVar7,sep->data,(long)iVar2);
              iVar7 = iVar7 + iVar2;
            }
            __n = (size_t)bl->entry[lVar9]->slen;
            memcpy(puVar3 + iVar7,bl->entry[lVar9]->data,__n);
            lVar8 = __n + (long)iVar7;
            lVar9 = lVar9 + 1;
            iVar7 = (int)lVar8;
          } while (iVar6 != lVar9);
        }
        puVar3[lVar8] = '\0';
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (bstring)0x0;
}

Assistant:

bstring bjoin (const struct bstrList * bl, const bstring sep) {
bstring b;
int i, c, v;

	if (bl == NULL || bl->qty < 0) return NULL;
	if (sep != NULL && (sep->slen < 0 || sep->data == NULL)) return NULL;

	for (i = 0, c = 1; i < bl->qty; i++) {
		v = bl->entry[i]->slen;
		if (v < 0) return NULL;	/* Invalid input */
		c += v;
		if (c < 0) return NULL;	/* Wrap around ?? */
	}

	if (sep != NULL) c += (bl->qty - 1) * sep->slen;

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b == NULL) return NULL; /* Out of memory */
	b->data = (unsigned char *) bstr__alloc (c);
	if (b->data == NULL) {
		bstr__free (b);
		return NULL;
	}

	b->mlen = c;
	b->slen = c-1;

	for (i = 0, c = 0; i < bl->qty; i++) {
		if (i > 0 && sep != NULL) {
			bstr__memcpy (b->data + c, sep->data, sep->slen);
			c += sep->slen;
		}
		v = bl->entry[i]->slen;
		bstr__memcpy (b->data + c, bl->entry[i]->data, v);
		c += v;
	}
	b->data[c] = (unsigned char) '\0';
	return b;
}